

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_size(Backend *be,int width,int height)

{
  int local_30 [2];
  int ypixel;
  int xpixel;
  winsize size;
  Pty *pty;
  int height_local;
  int width_local;
  Backend *be_local;
  
  size = (winsize)(be + -0x10c);
  local_30[1] = 0;
  local_30[0] = 0;
  *(int *)((long)&be[-5].interactor + 4) = width;
  *(int *)&be[-4].vt = height;
  if (-1 < *(int *)&be[-0x10c].interactor) {
    seat_get_window_pixel_size((Seat *)be[-0x106].interactor,local_30 + 1,local_30);
    ypixel._0_2_ = (undefined2)*(undefined4 *)((long)size + 0x1080);
    ypixel._2_2_ = (undefined2)*(undefined4 *)((long)size + 0x107c);
    xpixel._0_2_ = (undefined2)local_30[1];
    xpixel._2_2_ = (undefined2)local_30[0];
    ioctl(*(int *)((long)size + 8),0x5414,&ypixel);
  }
  return;
}

Assistant:

static void pty_size(Backend *be, int width, int height)
{
    Pty *pty = container_of(be, Pty, backend);
    struct winsize size;
    int xpixel = 0, ypixel = 0;

    pty->term_width = width;
    pty->term_height = height;

    if (pty->master_fd < 0)
        return;

    seat_get_window_pixel_size(pty->seat, &xpixel, &ypixel);

    size.ws_row = (unsigned short)pty->term_height;
    size.ws_col = (unsigned short)pty->term_width;
    size.ws_xpixel = (unsigned short)xpixel;
    size.ws_ypixel = (unsigned short)ypixel;
    ioctl(pty->master_fd, TIOCSWINSZ, (void *)&size);
    return;
}